

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_writer.cpp
# Opt level: O2

type duckdb::ParquetWriter::DuckDBTypeToParquetType(LogicalType *duckdb_type)

{
  bool bVar1;
  NotImplementedException *this;
  allocator local_5d;
  type result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  bVar1 = TryGetParquetType(duckdb_type,(optional_ptr<duckdb_parquet::Type::type,_true>)&result);
  if (bVar1) {
    return result;
  }
  this = (NotImplementedException *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string
            ((string *)&local_38,"Unimplemented type for Parquet \"%s\"",&local_5d);
  duckdb::LogicalType::ToString_abi_cxx11_();
  NotImplementedException::NotImplementedException<std::__cxx11::string>(this,&local_38,&local_58);
  __cxa_throw(this,&NotImplementedException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Type::type ParquetWriter::DuckDBTypeToParquetType(const LogicalType &duckdb_type) {
	Type::type result;
	if (TryGetParquetType(duckdb_type, &result)) {
		return result;
	}
	throw NotImplementedException("Unimplemented type for Parquet \"%s\"", duckdb_type.ToString());
}